

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O2

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::calcOrientation_simplified
          (DeadReckoningCalculator *this,EulerAngles *OrientationOut,KFLOAT32 totalTimeSinceReset)

{
  bool bVar1;
  KFLOAT32 *pKVar2;
  float fVar3;
  float fVar4;
  EulerAngles local_50;
  EulerAngles local_38;
  
  DATA_TYPE::EulerAngles::operator*
            (&local_50,&this->m_initEulerAngularVelocity,
             (KFLOAT64)(double)(float)totalTimeSinceReset);
  DATA_TYPE::EulerAngles::operator+(&this->m_initOrientation,&local_50);
  OrientationOut->m_f32Phi = local_38.m_f32Phi;
  OrientationOut->m_f32Psi = local_38.m_f32Psi;
  OrientationOut->m_f32Theta = local_38.m_f32Theta;
  DATA_TYPE::EulerAngles::~EulerAngles(&local_38);
  DATA_TYPE::EulerAngles::~EulerAngles(&local_50);
  pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
  fVar3 = 1.5707964 - (float)*pKVar2;
  bVar1 = fVar3 < 0.001;
  if (fVar3 < 0.0) {
    bVar1 = -0.001 < fVar3;
  }
  if (bVar1) {
    pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
    fVar3 = (float)*pKVar2;
    pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
    *pKVar2 = (KFLOAT32)(3.1415927 - fVar3);
    pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
    fVar3 = (float)*pKVar2;
    pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
    fVar4 = (float)*pKVar2;
    if (0.0 <= fVar3) {
      if (fVar4 <= 0.0) goto LAB_0016c214;
      pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
      fVar4 = (float)*pKVar2;
      fVar3 = 1.5707964;
    }
    else {
      fVar3 = -1.5707964;
    }
    pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,1);
    *pKVar2 = (KFLOAT32)(fVar3 - fVar4);
  }
LAB_0016c214:
  pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
  fVar3 = (float)*pKVar2;
  if (-3.1415927 <= fVar3) {
    if (3.1415927 < fVar3) {
      fVar3 = fVar3 + -6.2831855;
    }
  }
  else {
    fVar3 = fVar3 + 6.2831855;
  }
  pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,0);
  *pKVar2 = (KFLOAT32)fVar3;
  pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,2);
  fVar3 = (float)*pKVar2;
  if (-3.1415927 <= fVar3) {
    if (3.1415927 < fVar3) {
      fVar3 = fVar3 + -6.2831855;
    }
  }
  else {
    fVar3 = fVar3 + 6.2831855;
  }
  pKVar2 = DATA_TYPE::EulerAngles::operator[](OrientationOut,2);
  *pKVar2 = (KFLOAT32)fVar3;
  return;
}

Assistant:

void DeadReckoningCalculator::calcOrientation_simplified( EulerAngles & OrientationOut, const KFLOAT32 totalTimeSinceReset )
{
    /* Orientation */
    // A simpler way from the IEEE method:
    /*
        m_curOrientation += ( toEulerAngularVelocity( m_initAngularVelocity, m_curOrientation ) * DeltaTime );
    */
    OrientationOut = m_initOrientation + m_initEulerAngularVelocity * totalTimeSinceReset;
    // make sure the Pitch is between -90 and +90 degrees
    // also handle the discontinuity when Pitch is very close to +-90
    if( equivalent<KFLOAT32>( OrientationOut[1], KDIS_PI_2, MAGIC_EPSILON * 100 ) ) {
        OrientationOut[0] = KDIS_PI - OrientationOut[0]; //reflecting the heading angle, to avoid discontinuity
        if (OrientationOut[1] < 0)
            OrientationOut[1] =  (-KDIS_PI_2-OrientationOut[1]);
        else if (OrientationOut[1] > 0)
            OrientationOut[1] = (KDIS_PI_2-OrientationOut[1]);
    }

    // Make sure the value is within -180 and +180 degrees for Heading and Roll.
    OrientationOut[0] = checkAngleHR( OrientationOut[0]);
    OrientationOut[2] = checkAngleHR( OrientationOut[2]);
}